

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O2

void Omega_h::transfer_face_flux
               (Mesh *old_mesh,Mesh *new_mesh,LOs *same_ents2old_ents,LOs *same_ents2new_ents,
               LOs *prods2new_ents)

{
  Alloc *pAVar1;
  bool bVar2;
  Int IVar3;
  TagBase *this;
  string *__lhs;
  size_t sVar4;
  Int i;
  allocator local_dd;
  Int local_dc;
  Write<int> *local_d8;
  Mesh *local_d0;
  Write<int> *local_c8;
  Write<int> *local_c0;
  TagBase *local_b8;
  Read<double> prod_data;
  Write<int> local_a0;
  Read<double> old_data;
  Write<double> local_80;
  Write<int> local_70;
  Write<int> local_60;
  string local_50;
  
  i = 0;
  local_d8 = &prods2new_ents->write_;
  local_d0 = new_mesh;
  local_c8 = &same_ents2new_ents->write_;
  local_c0 = &same_ents2old_ents->write_;
  while( true ) {
    IVar3 = Mesh::ntags(old_mesh,2);
    if (IVar3 <= i) break;
    this = Mesh::get_tag(old_mesh,2,i);
    __lhs = TagBase::name_abi_cxx11_(this);
    bVar2 = std::operator==(__lhs,"magnetic face flux");
    if (bVar2) {
      local_dc = i;
      local_b8 = this;
      TagBase::name_abi_cxx11_(this);
      Mesh::get_array<double>((Mesh *)&old_data,(Int)old_mesh,(string *)0x2);
      pAVar1 = ((SharedAlloc *)&(local_d8->shared_alloc_).alloc)->alloc;
      if (((ulong)pAVar1 & 1) == 0) {
        sVar4 = pAVar1->size;
      }
      else {
        sVar4 = (ulong)pAVar1 >> 3;
      }
      std::__cxx11::string::string((string *)&local_50,"",&local_dd);
      Read<double>::Read(&prod_data,(LO)(sVar4 >> 2),0.0,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      Write<int>::Write(&local_60,local_c0);
      Write<int>::Write(&local_a0,local_c8);
      Write<int>::Write(&local_70,local_d8);
      Write<double>::Write(&local_80,&prod_data.write_);
      transfer_common<double>
                (old_mesh,local_d0,2,(LOs *)&local_60,(LOs *)&local_a0,(LOs *)&local_70,local_b8,
                 (Read<double> *)&local_80);
      Write<double>::~Write(&local_80);
      Write<int>::~Write(&local_70);
      Write<int>::~Write(&local_a0);
      Write<int>::~Write(&local_60);
      Write<double>::~Write(&prod_data.write_);
      Write<double>::~Write(&old_data.write_);
      i = local_dc;
    }
    i = i + 1;
  }
  return;
}

Assistant:

static void transfer_face_flux(Mesh* old_mesh, Mesh* new_mesh,
    LOs same_ents2old_ents, LOs same_ents2new_ents, LOs prods2new_ents) {
  for (Int i = 0; i < old_mesh->ntags(FACE); ++i) {
    TagBase const* tagbase = old_mesh->get_tag(FACE, i);
    if (tagbase->name() == "magnetic face flux") {
      Read<Real> old_data = old_mesh->get_array<Real>(FACE, tagbase->name());
      Read<Real> prod_data(prods2new_ents.size(), 0);
      transfer_common(old_mesh, new_mesh, FACE, same_ents2old_ents,
          same_ents2new_ents, prods2new_ents, tagbase, prod_data);
    }
  }
}